

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O1

void vu_draw_update(t_gobj *client,_glist *glist)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  _glist *in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _glist *p_Var8;
  _glist *extraout_RAX;
  ulong uVar9;
  ulong uVar10;
  char local_b8 [136];
  
  if (((ulong)client[0x4b].g_next & 1) != 0) {
    iVar2 = glist_isvisible(glist);
    in_RAX = (_glist *)CONCAT44(extraout_var,iVar2);
    if (iVar2 != 0) {
      iVar2 = *(int *)((long)&client[3].g_pd[1].c_floatmethod + 4);
      iVar1 = *(int *)((long)&client[4].g_pd + 4);
      iVar7 = iVar1 + 3;
      if (-1 < iVar1) {
        iVar7 = iVar1;
      }
      iVar3 = text_ypix((t_text *)client,glist);
      iVar4 = text_xpix((t_text *)client,glist);
      iVar1 = *(int *)((long)&client[4].g_pd + 4);
      iVar5 = sprintf(local_b8,"%lxRCOVER",client);
      p_Var8 = glist_getcanvas((_glist *)CONCAT44(extraout_var_00,iVar5));
      pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",local_b8,
                  (ulong)(uint)(((iVar7 >> 2) - iVar2) + iVar4),(ulong)(uint)(iVar3 - iVar2),
                  (ulong)(uint)((iVar2 - (iVar7 >> 2)) + iVar4 + iVar1),
                  (ulong)(uint)((0x28 - *(int *)&client[0x49].g_next) *
                                (*(int *)&client[0x49].g_pd + 1) * iVar2 + (iVar3 - iVar2)));
      in_RAX = extraout_RAX;
    }
    *(byte *)&client[0x4b].g_next = *(byte *)&client[0x4b].g_next & 0xfe;
  }
  if (((ulong)client[0x4b].g_next & 2) != 0) {
    p_Var8 = glist_getcanvas(in_RAX);
    iVar2 = glist_isvisible(glist);
    if (iVar2 != 0) {
      iVar2 = *(int *)((long)&client[3].g_pd[1].c_floatmethod + 4);
      uVar6 = text_xpix((t_text *)client,glist);
      iVar7 = text_ypix((t_text *)client,glist);
      sprintf(local_b8,"%lxPLED",client);
      iVar1 = *(int *)((long)&client[0x49].g_pd + 4);
      if ((long)iVar1 == 0) {
        uVar10 = (ulong)(*(int *)((long)&client[4].g_pd + 4) / 2 + uVar6);
        pdgui_vmess((char *)0x0,"crs rk",p_Var8,"itemconfigure",local_b8,"-fill",
                    (ulong)*(uint *)&client[0x45].g_pd);
        uVar9 = (ulong)(uint)(iVar7 + iVar2 * 10);
        pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",local_b8,uVar10,uVar9,uVar10,uVar9);
      }
      else {
        iVar3 = iemgui_vu_col[iVar1];
        iVar4 = (*(int *)&client[0x49].g_pd + 1) * iVar2;
        uVar9 = (ulong)(uint)(((0x29 - iVar1) * iVar4 + iVar7) - iVar4 / 2);
        pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",local_b8,(ulong)uVar6,uVar9,
                    (ulong)(uVar6 + iVar2 + *(int *)((long)&client[4].g_pd + 4)),uVar9);
        pdgui_vmess((char *)0x0,"crs rk",p_Var8,"itemconfigure",local_b8,"-fill",
                    (ulong)(uint)iemgui_color_hex[iVar3]);
      }
    }
    *(byte *)&client[0x4b].g_next = *(byte *)&client[0x4b].g_next & 0xfd;
  }
  return;
}

Assistant:

static void vu_draw_update(t_gobj *client, t_glist *glist)
{
    t_vu *x = (t_vu *)client;
    if (x->x_updaterms)
    {
        vu_update_rms(x, glist);
        x->x_updaterms = 0;
    }
    if (x->x_updatepeak)
    {
        vu_update_peak(x, glist);
        x->x_updatepeak = 0;
    }
}